

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w)

{
  uint uVar1;
  uint uVar2;
  CUPDLPproblem *pCVar3;
  CUPDLPdata *pCVar4;
  cupdlp_retcode cVar5;
  uint uVar6;
  CUPDLPsettings *pCVar7;
  CUPDLPresobj *pCVar8;
  CUPDLPiterates *pCVar9;
  CUPDLPstepsize *pCVar10;
  CUPDLPtimers *pCVar11;
  CUPDLPvec *vec;
  cupdlp_float *pcVar12;
  cupdlp_retcode cVar13;
  size_t __nmemb;
  
  pCVar7 = (CUPDLPsettings *)malloc(0x48);
  w->settings = pCVar7;
  cVar13 = 1;
  if (pCVar7 != (CUPDLPsettings *)0x0) {
    pCVar8 = (CUPDLPresobj *)malloc(0x188);
    w->resobj = pCVar8;
    if (pCVar8 != (CUPDLPresobj *)0x0) {
      pCVar9 = (CUPDLPiterates *)malloc(0xa0);
      w->iterates = pCVar9;
      if (pCVar9 != (CUPDLPiterates *)0x0) {
        pCVar10 = (CUPDLPstepsize *)malloc(0x40);
        w->stepsize = pCVar10;
        if (pCVar10 != (CUPDLPstepsize *)0x0) {
          pCVar11 = (CUPDLPtimers *)malloc(0x58);
          w->timers = pCVar11;
          if (pCVar11 != (CUPDLPtimers *)0x0) {
            pCVar11->nIter = 0;
            pCVar11->dSolvingTime = 0.0;
            pCVar11->dSolvingBeg = 0.0;
            pCVar11->dScalingTime = 0.0;
            pCVar11->dPresolveTime = 0.0;
            pCVar11->dAtyTime = 0.0;
            pCVar11->dAxTime = 0.0;
            pCVar11->dComputeResidualsTime = 0.0;
            pCVar11->dUpdateIterateTime = 0.0;
            pCVar11->nAtyCalls = 0;
            pCVar11->nAxCalls = 0;
            pCVar11->nComputeResidualsCalls = 0;
            pCVar11->nUpdateIterateCalls = 0;
            my_clock();
            vec = (CUPDLPvec *)malloc(0x10);
            w->buffer = vec;
            if (vec != (CUPDLPvec *)0x0) {
              pCVar3 = w->problem;
              cVar5 = vec_Alloc(vec,pCVar3->data->nRows);
              if (cVar5 == 0) {
                pCVar4 = pCVar3->data;
                uVar1 = pCVar4->nCols;
                uVar2 = pCVar4->nRows;
                uVar6 = uVar2;
                if ((int)uVar2 < (int)uVar1) {
                  uVar6 = uVar1;
                }
                __nmemb = 0x800;
                if (0x800 < (int)uVar6) {
                  __nmemb = (size_t)uVar6;
                }
                pcVar12 = (cupdlp_float *)calloc(__nmemb,8);
                w->buffer2 = pcVar12;
                if (pcVar12 != (cupdlp_float *)0x0) {
                  pcVar12 = (cupdlp_float *)calloc(__nmemb,8);
                  w->buffer3 = pcVar12;
                  if (pcVar12 != (cupdlp_float *)0x0) {
                    pcVar12 = (cupdlp_float *)calloc((long)(int)uVar1,8);
                    w->colScale = pcVar12;
                    if (pcVar12 != (cupdlp_float *)0x0) {
                      pcVar12 = (cupdlp_float *)calloc((long)(int)uVar2,8);
                      w->rowScale = pcVar12;
                      if (pcVar12 != (cupdlp_float *)0x0) {
                        settings_Alloc(w->settings);
                        pCVar4 = w->problem->data;
                        cVar5 = resobj_Alloc(w->resobj,w->problem,pCVar4->nCols,pCVar4->nRows);
                        if (cVar5 == 0) {
                          pCVar4 = w->problem->data;
                          cVar5 = iterates_Alloc(w->iterates,pCVar4->nCols,pCVar4->nRows);
                          if (cVar5 == 0) {
                            pCVar10 = w->stepsize;
                            pCVar10->eLineSearchMethod = PDHG_ADAPTIVE_LINESEARCH;
                            pCVar10->dPrimalStep = 0.0;
                            pCVar10->dDualStep = 0.0;
                            pCVar10->dSumPrimalStep = 0.0;
                            pCVar10->dSumDualStep = 0.0;
                            pCVar10->dBeta = 0.0;
                            pCVar10->dTheta = 0.0;
                            pCVar10->nStepSizeIter = 0;
                            cVar13 = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return cVar13;
}

Assistant:

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLP_INIT_SETTINGS(w->settings, 1);
  CUPDLP_INIT_RESOBJ(w->resobj, 1);
  CUPDLP_INIT_ITERATES(w->iterates, 1);
  CUPDLP_INIT_STEPSIZE(w->stepsize, 1);

  CUPDLP_INIT_TIMERS(w->timers, 1);
  CUPDLP_CALL(timers_Alloc(w->timers));

  cupdlp_float begin = getTimeStamp();
  // buffer
  CUPDLP_INIT_CUPDLP_VEC(w->buffer, 1);
  CUPDLP_CALL(vec_Alloc(w->buffer, w->problem->data->nRows));


  cupdlp_init_zero_vec_double(w->buffer2,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#if defined(CUPDLP_CPU) || !(USE_KERNELS) || (CUPDLP_DUMP_LINESEARCH_STATS && CUPDLP_DEBUG)
  cupdlp_init_zero_vec_double(w->buffer3,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#else
  w->buffer3 = NULL;
#endif

  // for scaling
  cupdlp_init_zero_vec_double(w->colScale, w->problem->data->nCols);
  cupdlp_init_zero_vec_double(w->rowScale, w->problem->data->nRows);

  CUPDLP_CALL(settings_Alloc(w->settings));
  CUPDLP_CALL(resobj_Alloc(w->resobj, w->problem, w->problem->data->nCols,
                           w->problem->data->nRows));
  CUPDLP_CALL(iterates_Alloc(w->iterates, w->problem->data->nCols,
                             w->problem->data->nRows));
  CUPDLP_CALL(stepsize_Alloc(w->stepsize));

#ifndef CUPDLP_CPU
  //   CHECK_CUSPARSE(cusparseCreate(&w->cusparsehandle));
  //   CHECK_CUBLAS(cublasCreate(&w->cublashandle));
  CUPDLP_CALL(cuda_alloc_MVbuffer(
      //   w->problem->data->matrix_format,
      w->cusparsehandle, w->problem->data->csc_matrix->cuda_csc,
      w->iterates->x[0]->cuda_vec, w->iterates->ax[0]->cuda_vec,
      w->problem->data->csr_matrix->cuda_csr, w->iterates->y[0]->cuda_vec,
      w->iterates->aty[0]->cuda_vec, &w->dBuffer_csc_ATy, &w->dBuffer_csr_Ax))
  w->timers->AllocMem_CopyMatToDeviceTime += getTimeStamp() - begin;
#endif

exit_cleanup:
  return retcode;
}